

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.cc
# Opt level: O2

void __thiscall Filter::Filter(Filter *this)

{
  this->hp_bp_lp = 0;
  this->vol = 0;
  this->fc = 0;
  this->res = 0;
  this->filt = 0;
  this->voice3off = 0;
  this->Vhp = 0;
  this->Vbp = 0;
  this->Vlp = 0;
  this->Vnf = 0;
  this->enabled = true;
  interpolate<int(*)[2],PointPlotter<int>>
            ((int (*) [2])f0_points_6581,(int (*) [2])(f0_points_6581 + 0x1e),
             (PointPlotter<int>)this->f0_6581,1.0);
  interpolate<int(*)[2],PointPlotter<int>>
            ((int (*) [2])f0_points_8580,(int (*) [2])(f0_points_8580 + 0x12),
             (PointPlotter<int>)this->f0_8580,1.0);
  set_chip_model(this,MOS6581);
  return;
}

Assistant:

Filter::Filter()
{
  fc = 0;

  res = 0;

  filt = 0;

  voice3off = 0;

  hp_bp_lp = 0;

  vol = 0;

  // State of filter.
  Vhp = 0;
  Vbp = 0;
  Vlp = 0;
  Vnf = 0;

  enable_filter(true);

  // Create mappings from FC to cutoff frequency.
  interpolate(f0_points_6581, f0_points_6581
	      + sizeof(f0_points_6581)/sizeof(*f0_points_6581) - 1,
	      PointPlotter<sound_sample>(f0_6581), 1.0);
  interpolate(f0_points_8580, f0_points_8580
	      + sizeof(f0_points_8580)/sizeof(*f0_points_8580) - 1,
	      PointPlotter<sound_sample>(f0_8580), 1.0);

  set_chip_model(MOS6581);
}